

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void nlohmann::adl_serializer<Eigen::Matrix<double,1,3,1,1,3>,void>::
     from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *json,Vector<3> *point)

{
  size_type sVar1;
  size_type sVar2;
  Index IVar3;
  const_reference this;
  Scalar *v;
  int local_1c;
  int i;
  Vector<3> *point_local;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *json_local;
  
  sVar1 = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(json);
  sVar2 = Eigen::EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::size
                    ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)point);
  if (sVar1 == sVar2) {
    local_1c = 0;
    while( true ) {
      IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::size
                        ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)point);
      if (IVar3 <= local_1c) break;
      this = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(json,(long)local_1c);
      v = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)point,
                     (long)local_1c);
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::get_to<double,_0>(this,v);
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("json.size() == point.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/Json.h"
                ,0x4c,
                "static void nlohmann::adl_serializer<Eigen::Matrix<double, 1, 3>>::from_json(const TJson &, anurbs::linear_algebra::Vector<3> &) [TJson = nlohmann::basic_json<anurbs::FiFoMap>]"
               );
}

Assistant:

static void from_json(const TJson& json, anurbs::linear_algebra::Vector<3>& point)
        {
            assert(json.size() == point.size());

            for (int i = 0; i < point.size(); i++) {
                json.at(i).get_to(point[i]);
            }
        }